

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O3

int evmap_foreach_event_(event_base *base,event_base_foreach_event_cb fn,void *arg)

{
  long *plVar1;
  int iVar2;
  event *peVar3;
  long lVar4;
  
  iVar2 = (base->io).nentries;
  if (0 < iVar2) {
    lVar4 = 0;
    do {
      plVar1 = (long *)(base->io).entries[lVar4];
      if ((plVar1 != (long *)0x0) && (peVar3 = (event *)*plVar1, peVar3 != (event *)0x0)) {
        do {
          iVar2 = (*fn)(base,peVar3,arg);
          if (iVar2 != 0) {
            return iVar2;
          }
          peVar3 = (peVar3->ev_).ev_io.ev_io_next.le_next;
        } while (peVar3 != (event *)0x0);
        iVar2 = (base->io).nentries;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar2);
  }
  iVar2 = (base->sigmap).nentries;
  if (0 < iVar2) {
    lVar4 = 0;
    do {
      plVar1 = (long *)(base->sigmap).entries[lVar4];
      if ((plVar1 != (long *)0x0) && (peVar3 = (event *)*plVar1, peVar3 != (event *)0x0)) {
        do {
          iVar2 = (*fn)(base,peVar3,arg);
          if (iVar2 != 0) {
            return iVar2;
          }
          peVar3 = (peVar3->ev_).ev_io.ev_io_next.le_next;
        } while (peVar3 != (event *)0x0);
        iVar2 = (base->sigmap).nentries;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar2);
  }
  return 0;
}

Assistant:

int
evmap_foreach_event_(struct event_base *base,
    event_base_foreach_event_cb fn, void *arg)
{
	struct evmap_foreach_event_helper h;
	int r;
	h.fn = fn;
	h.arg = arg;
	if ((r = evmap_io_foreach_fd(base, evmap_io_foreach_event_fn, &h)))
		return r;
	return evmap_signal_foreach_signal(base, evmap_signal_foreach_event_fn, &h);
}